

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool __thiscall
metaf::TrendGroup::combineIncompleteGroups(TrendGroup *this,TrendGroup *nextTrendGroup)

{
  undefined3 uVar1;
  Probability PVar2;
  Type TVar3;
  TrendGroup *in_RSI;
  TrendGroup *in_RDI;
  
  PVar2 = probability(in_RDI);
  if (((PVar2 == NONE) && (TVar3 = type(in_RDI), TVar3 == FROM)) &&
     (TVar3 = type(in_RSI), TVar3 == UNTIL)) {
    in_RDI->t = TIME_SPAN;
    (in_RDI->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload_base<unsigned_int>)
         (in_RSI->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
         super__Optional_base<unsigned_int,_true,_true>._M_payload;
    *(undefined8 *)
     ((long)&(in_RDI->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) =
         *(undefined8 *)
          ((long)&(in_RSI->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                  super__Optional_payload_base<metaf::MetafTime>._M_payload + 8);
    uVar1 = *(undefined3 *)
             &(in_RSI->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
              super__Optional_payload_base<metaf::MetafTime>.field_0x11;
    (in_RDI->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_engaged =
         (in_RSI->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged;
    *(undefined3 *)
     &(in_RDI->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>.field_0x11 = uVar1;
    return true;
  }
  return false;
}

Assistant:

bool TrendGroup::combineIncompleteGroups(const TrendGroup & nextTrendGroup) {
	if (probability() != Probability::NONE ||
		type() != Type::FROM ||
		nextTrendGroup.type() != Type::UNTIL) return false;
	t = Type::TIME_SPAN;
	tTill = nextTrendGroup.tTill;
	return true;
}